

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::DecodeBase64(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)> local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::function<cfd::js::api::HexDataStruct(cfd::js::api::Base64DataStruct_const&)>::
  function<cfd::js::api::HexDataStruct(&)(cfd::js::api::Base64DataStruct_const&),void>
            ((function<cfd::js::api::HexDataStruct(cfd::js::api::Base64DataStruct_const&)> *)
             &local_38,UtilStructApi::DecodeBase64);
  ExecuteJsonApi<cfd::js::api::json::Base64Data,cfd::js::api::json::HexData,cfd::js::api::Base64DataStruct,cfd::js::api::HexDataStruct>
            ((json *)this,request_message,&local_38);
  std::function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)>::~function
            (&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::DecodeBase64(const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::Base64Data, api::json::HexData, api::Base64DataStruct,
      api::HexDataStruct>(request_message, UtilStructApi::DecodeBase64);
}